

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printFunction(PrinterStream *this,Function *f)

{
  pool_ref<soul::heart::Variable> *ppVar1;
  pointer ppVar2;
  CodePrinter *pCVar3;
  char c;
  char *s;
  pointer ppVar4;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> parameters;
  string local_40;
  
  if ((f->name).name != (string *)0x0) {
    s = "function ";
    if ((f->functionType).type == event) {
      s = "event ";
    }
    choc::text::CodePrinter::operator<<(this->out,s);
    pCVar3 = this->out;
    getFunctionName_abi_cxx11_(&local_40,this,f);
    choc::text::CodePrinter::operator<<(pCVar3,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    ppVar1 = (f->parameters).items;
    parameters.e = ppVar1 + (f->parameters).numActive;
    parameters.s = ppVar1;
    printParameters(this,parameters);
    if ((f->functionType).type != event) {
      pCVar3 = choc::text::CodePrinter::operator<<(this->out," -> ");
      getTypeDescription_abi_cxx11_(&local_40,this,&f->returnType);
      choc::text::CodePrinter::operator<<(pCVar3,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    printDescription(this,&f->annotation);
    pCVar3 = this->out;
    if (f->hasNoBody == true) {
      c = ';';
    }
    else {
      choc::text::CodePrinter::startNewLine(pCVar3);
      pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,'{');
      choc::text::CodePrinter::startNewLine(pCVar3);
      buildLocalVariableList(this,f);
      ppVar2 = (f->blocks).
               super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar4 = (f->blocks).
                    super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1
          ) {
        printBlock(this,ppVar4->object);
      }
      pCVar3 = this->out;
      c = '}';
    }
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,c);
    choc::text::CodePrinter::operator<<(pCVar3,(BlankLine *)&blankLine);
    return;
  }
  throwInternalCompilerError("f.name.isValid()","printFunction",300);
}

Assistant:

static std::string getDump (const Program& p)
    {
        choc::text::CodePrinter out;
        print (p, out);
        return out.toString();
    }